

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_claim_root(Tree *this)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  long in_RDI;
  char msg [23];
  size_t r;
  Tree *in_stack_00000140;
  size_t in_stack_00000428;
  size_t in_stack_00000430;
  size_t in_stack_00000438;
  Tree *in_stack_00000440;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  Location *in_stack_ffffffffffffff90;
  char local_28 [24];
  size_t local_10;
  
  local_10 = _claim(in_stack_00000140);
  if (local_10 != 0) {
    builtin_strncpy(local_28,"check failed: (r == 0)",0x17);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    (*pcVar1)(local_28,0x17,*(undefined8 *)(in_RDI + 0x40));
  }
  _set_hierarchy(in_stack_00000440,in_stack_00000438,in_stack_00000430,in_stack_00000428);
  return;
}

Assistant:

void Tree::_claim_root()
{
    size_t r = _claim();
    _RYML_CB_ASSERT(m_callbacks, r == 0);
    _set_hierarchy(r, NONE, NONE);
}